

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O3

ParameterPoint *
anurbs::PointOnCurveProjection<3L>::project_to_line
          (ParameterPoint *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,double *t0,
          double *t1)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0];
  dVar2 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  dVar5 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [0] - dVar3;
  dVar6 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1] - dVar2;
  dVar4 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
  dVar7 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2] - dVar4;
  dVar8 = dVar7 * dVar7 + dVar6 * dVar6 + dVar5 * dVar5;
  if (1e-14 <= dVar8) {
    dVar8 = 1.0 / dVar8;
    dVar8 = ((point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[1] - dVar2) * dVar8 * dVar6 +
            ((point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[0] - dVar3) * dVar8 * dVar5 +
            ((point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
             array[2] - dVar4) * dVar7 * dVar8;
    if (0.0 <= dVar8) {
      if (dVar8 <= 1.0) {
        dVar2 = dVar2 + dVar6 * dVar8;
        __return_storage_ptr__->first = (*t1 - *t0) * dVar8 + *t0;
        auVar1._8_4_ = SUB84(dVar2,0);
        auVar1._0_8_ = dVar3 + dVar5 * dVar8;
        auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
        *(undefined1 (*) [16])
         (__return_storage_ptr__->second).
         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array =
             auVar1;
        (__return_storage_ptr__->second).
        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
             dVar4 + dVar7 * dVar8;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->first = *t1;
      dVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
              array[1];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[0] =
           (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
           [0];
      (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
      m_storage.m_data.array[1] = dVar4;
      dVar4 = (b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
              array[2];
      goto LAB_00196162;
    }
  }
  __return_storage_ptr__->first = *t0;
  dVar4 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[0] =
       (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[1] = dVar4;
  dVar4 = (a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array
          [2];
LAB_00196162:
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
  m_storage.m_data.array[2] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

static ParameterPoint project_to_line(const Vector& point, const Vector& a, const Vector& b, const double& t0, const double& t1)
    {
        const Vector dif = b - a;
        const double l = squared_norm(dif);

        if (l < 1e-14) {
            return {t0, a};
        }

        const Vector o = a;
        const Vector r = dif * (1.0 / l);
        const Vector o2pt = point - o;
        const double do2ptr = dot(o2pt, r);

        if (do2ptr < 0) {
            return {t0, a};
        }

        if (do2ptr > 1) {
            return {t1, b};
        }

        const double t = t0 + (t1 - t0) * do2ptr;
        const Vector closest_point = o + dif * do2ptr;

        return {t, closest_point};
    }